

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getNextLeak
          (MemoryLeakDetectorTable *this,MemoryLeakDetectorNode *leak,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *pMVar1;
  ulong uVar2;
  
  pMVar1 = leak->next_;
  if (pMVar1 != (MemoryLeakDetectorNode *)0x0 && period != mem_leak_period_all) {
    do {
      if ((pMVar1->period_ == period) ||
         (period == mem_leak_period_enabled && pMVar1->period_ != mem_leak_period_disabled)) break;
      pMVar1 = pMVar1->next_;
    } while (pMVar1 != (MemoryLeakDetectorNode *)0x0);
  }
  if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
    uVar2 = (ulong)leak->memory_ % 0x49;
    do {
      if (0x47 < uVar2) {
        return (MemoryLeakDetectorNode *)0x0;
      }
      pMVar1 = this->table_[uVar2 + 1].head_;
      if (period != mem_leak_period_all) {
        for (; pMVar1 != (MemoryLeakDetectorNode *)0x0; pMVar1 = pMVar1->next_) {
          if ((pMVar1->period_ == period) ||
             (period == mem_leak_period_enabled && pMVar1->period_ != mem_leak_period_disabled))
          break;
        }
      }
      uVar2 = uVar2 + 1;
    } while (pMVar1 == (MemoryLeakDetectorNode *)0x0);
  }
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getNextLeak(MemoryLeakDetectorNode* leak, MemLeakPeriod period)
{
    unsigned long i = hash(leak->memory_);
    MemoryLeakDetectorNode* node = table_[i].getNextLeak(leak, period);
    if (node) return node;

    for (++i; i < hash_prime; i++) {
        node = table_[i].getFirstLeak(period);
        if (node) return node;
    }
    return NULLPTR;
}